

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::ArenaTest_MoveCtorOnArena_Test::TestBody(ArenaTest_MoveCtorOnArena_Test *this)

{
  bool bVar1;
  char *pcVar2;
  TestAllTypes *pTVar3;
  NestedTestAllTypes *this_00;
  uint64_t uVar4;
  AssertHelper local_168;
  Message local_160;
  unsigned_long local_158;
  undefined1 local_150 [8];
  AssertionResult gtest_ar_2;
  Message local_138;
  unsigned_long local_130;
  undefined1 local_128 [8];
  AssertionResult gtest_ar_1;
  uint64_t usage_by_move;
  NestedTestAllTypes *moved;
  uint64_t usage_original;
  NestedTestAllTypes *original;
  AssertHelper local_f0;
  Message local_e8;
  int local_e0 [4];
  uint64_t local_d0;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar;
  Arena arena;
  ArenaTest_MoveCtorOnArena_Test *this_local;
  
  Arena::Arena((Arena *)&gtest_ar.message_);
  local_d0 = Arena::SpaceUsed((Arena *)&gtest_ar.message_);
  local_e0[0] = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_c8,"arena.SpaceUsed()","0",&local_d0,local_e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x1a7,pcVar2);
    testing::internal::AssertHelper::operator=(&local_f0,&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    testing::Message::~Message(&local_e8);
  }
  original._4_4_ = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  if (original._4_4_ == 0) {
    usage_original =
         (uint64_t)Arena::Create<proto2_unittest::NestedTestAllTypes>((Arena *)&gtest_ar.message_);
    pTVar3 = proto2_unittest::NestedTestAllTypes::mutable_payload
                       ((NestedTestAllTypes *)usage_original);
    TestUtil::SetAllFields<proto2_unittest::TestAllTypes>(pTVar3);
    pTVar3 = proto2_unittest::NestedTestAllTypes::payload((NestedTestAllTypes *)usage_original);
    TestUtil::ExpectAllFieldsSet<proto2_unittest::TestAllTypes>(pTVar3);
    moved = (NestedTestAllTypes *)Arena::SpaceUsed((Arena *)&gtest_ar.message_);
    this_00 = Arena::Create<proto2_unittest::NestedTestAllTypes,proto2_unittest::NestedTestAllTypes>
                        ((Arena *)&gtest_ar.message_,(NestedTestAllTypes *)usage_original);
    uVar4 = Arena::SpaceUsed((Arena *)&gtest_ar.message_);
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(uVar4 - (long)moved);
    pTVar3 = proto2_unittest::NestedTestAllTypes::payload(this_00);
    TestUtil::ExpectAllFieldsSet<proto2_unittest::TestAllTypes>(pTVar3);
    local_130 = 0x50;
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              ((EqHelper *)local_128,"usage_by_move","sizeof(NestedTestAllTypes)",
               (unsigned_long *)&gtest_ar_1.message_,&local_130);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
    if (!bVar1) {
      testing::Message::Message(&local_138);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
                 ,0x1b4,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_138);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_138);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
    local_158 = (long)gtest_ar_1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl + 0x340;
    testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
              ((internal *)local_150,"usage_by_move + sizeof(TestAllTypes)","usage_original",
               &local_158,(unsigned_long *)&moved);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
    if (!bVar1) {
      testing::Message::Message(&local_160);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_150);
      testing::internal::AssertHelper::AssertHelper
                (&local_168,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
                 ,0x1b5,pcVar2);
      testing::internal::AssertHelper::operator=(&local_168,&local_160);
      testing::internal::AssertHelper::~AssertHelper(&local_168);
      testing::Message::~Message(&local_160);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
    pTVar3 = proto2_unittest::NestedTestAllTypes::payload((NestedTestAllTypes *)usage_original);
    TestUtil::ExpectClear<proto2_unittest::TestAllTypes>(pTVar3);
    original._4_4_ = 0;
  }
  Arena::~Arena((Arena *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(ArenaTest, MoveCtorOnArena) {
  Arena arena;

  ASSERT_EQ(arena.SpaceUsed(), 0);

  auto* original = Arena::Create<NestedTestAllTypes>(&arena);
  TestUtil::SetAllFields(original->mutable_payload());
  TestUtil::ExpectAllFieldsSet(original->payload());

  auto usage_original = arena.SpaceUsed();
  auto* moved = Arena::Create<NestedTestAllTypes>(&arena, std::move(*original));
  auto usage_by_move = arena.SpaceUsed() - usage_original;

  TestUtil::ExpectAllFieldsSet(moved->payload());

  // The only extra allocation with moves is sizeof(NestedTestAllTypes).
  EXPECT_EQ(usage_by_move, sizeof(NestedTestAllTypes));
  EXPECT_LT(usage_by_move + sizeof(TestAllTypes), usage_original);

  // Status after move is unspecified and must not be assumed. It's merely
  // checking current implementation specifics for protobuf internal.
  TestUtil::ExpectClear(original->payload());
}